

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O2

void __thiscall duckdb::StringValueScanner::ProcessExtraRow(StringValueScanner *this)

{
  idx_t *piVar1;
  shared_ptr<duckdb::CSVStateMachine,_true> *this_00;
  ulong uVar2;
  byte bVar3;
  CSVState CVar4;
  CSVState CVar5;
  ulong uVar6;
  CSVBufferHandle *pCVar7;
  CSVStateMachine *pCVar8;
  idx_t buffer_pos;
  StringValueResult *this_01;
  idx_t *local_38;
  
  this_01 = &this->result;
  StringValueResult::NullPaddingQuotedNewlineCheck(this_01);
  pCVar7 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->
                     (&(this->super_BaseScanner).cur_buffer_handle);
  uVar6 = pCVar7->actual_size;
  piVar1 = &(this->super_BaseScanner).iterator.pos.buffer_pos;
  this_00 = &(this->super_BaseScanner).state_machine;
  uVar2 = uVar6 - 1;
  local_38 = &(this->super_BaseScanner).lines_read;
  buffer_pos = (this->super_BaseScanner).iterator.pos.buffer_pos;
LAB_01ae497f:
  if (uVar6 <= buffer_pos) {
    return;
  }
  pCVar8 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
  buffer_pos = (this->super_BaseScanner).iterator.pos.buffer_pos;
  bVar3 = (this->super_BaseScanner).buffer_handle_ptr[buffer_pos];
  CVar4 = (this->super_BaseScanner).states.states[1];
  (this->super_BaseScanner).states.states[0] = CVar4;
  CVar5 = pCVar8->transition_array->state_machine[bVar3][CVar4];
  (this->super_BaseScanner).states.states[1] = CVar5;
  switch(CVar5) {
  case STANDARD:
    do {
      (this->super_BaseScanner).iterator.pos.buffer_pos = buffer_pos + 1;
      pCVar8 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
      buffer_pos = (this->super_BaseScanner).iterator.pos.buffer_pos;
      if (uVar2 <= buffer_pos) break;
    } while (pCVar8->transition_array->skip_standard
             [(byte)(this->super_BaseScanner).buffer_handle_ptr[buffer_pos]] != false);
    goto LAB_01ae497f;
  case DELIMITER:
    StringValueResult::AddValue(this_01,buffer_pos);
    goto LAB_01ae4ab7;
  case RECORD_SEPARATOR:
    if (CVar4 != CARRIAGE_RETURN) goto switchD_01ae49c8_caseD_6;
    *local_38 = *local_38 + 1;
    break;
  case CARRIAGE_RETURN:
switchD_01ae49c8_caseD_6:
    if (CVar4 == RECORD_SEPARATOR) {
      StringValueResult::EmptyLine(this_01,buffer_pos);
    }
    else if ((this->result).super_ScannerResult.comment == true) {
      StringValueResult::UnsetComment(this_01,buffer_pos);
    }
    else {
      StringValueResult::AddRow(this_01,buffer_pos);
    }
    *piVar1 = *piVar1 + 1;
LAB_01ae4b60:
    *local_38 = *local_38 + 1;
    return;
  case QUOTED:
    if (CVar4 == UNQUOTED) {
      (this->result).super_ScannerResult.escaped = true;
    }
    if ((this_01->super_ScannerResult).quoted == false) {
      (this->result).super_ScannerResult.quoted_position = buffer_pos;
    }
    (this->result).super_ScannerResult.quoted = true;
    (this->result).super_ScannerResult.unquoted = true;
    do {
      (this->super_BaseScanner).iterator.pos.buffer_pos = buffer_pos + 1;
      pCVar8 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
      buffer_pos = (this->super_BaseScanner).iterator.pos.buffer_pos;
      if (uVar2 <= buffer_pos) break;
    } while (pCVar8->transition_array->skip_quoted
             [(byte)(this->super_BaseScanner).buffer_handle_ptr[buffer_pos]] != false);
    goto LAB_01ae497f;
  case UNQUOTED:
    ScannerResult::SetUnquoted(&this_01->super_ScannerResult);
LAB_01ae4ab7:
    buffer_pos = *piVar1;
    break;
  case ESCAPE:
  case UNQUOTED_ESCAPE:
  case ESCAPED_RETURN:
    (this->result).super_ScannerResult.escaped = true;
    break;
  case INVALID:
    StringValueResult::InvalidState(this_01);
    local_38 = piVar1;
    goto LAB_01ae4b60;
  case QUOTED_NEW_LINE:
    (this->result).quoted_new_line = true;
    StringValueResult::NullPaddingQuotedNewlineCheck(this_01);
    buffer_pos = (this->super_BaseScanner).iterator.pos.buffer_pos;
    break;
  case COMMENT:
    goto switchD_01ae49c8_caseD_e;
  }
  buffer_pos = buffer_pos + 1;
  *piVar1 = buffer_pos;
  goto LAB_01ae497f;
switchD_01ae49c8_caseD_e:
  if ((this->result).super_ScannerResult.comment == false) {
    (this->result).position_before_comment = buffer_pos;
    (this->result).super_ScannerResult.comment = true;
  }
  do {
    (this->super_BaseScanner).iterator.pos.buffer_pos = buffer_pos + 1;
    pCVar8 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
    buffer_pos = (this->super_BaseScanner).iterator.pos.buffer_pos;
    if (uVar2 <= buffer_pos) break;
  } while (pCVar8->transition_array->skip_comment
           [(byte)(this->super_BaseScanner).buffer_handle_ptr[buffer_pos]] != false);
  goto LAB_01ae497f;
}

Assistant:

void StringValueScanner::ProcessExtraRow() {
	result.NullPaddingQuotedNewlineCheck();
	idx_t to_pos = cur_buffer_handle->actual_size;
	while (iterator.pos.buffer_pos < to_pos) {
		state_machine->Transition(states, buffer_handle_ptr[iterator.pos.buffer_pos]);
		switch (states.states[1]) {
		case CSVState::INVALID:
			result.InvalidState(result);
			iterator.pos.buffer_pos++;
			return;
		case CSVState::RECORD_SEPARATOR:
			if (states.states[0] == CSVState::RECORD_SEPARATOR) {
				result.EmptyLine(result, iterator.pos.buffer_pos);
				iterator.pos.buffer_pos++;
				lines_read++;
				return;
			} else if (states.states[0] != CSVState::CARRIAGE_RETURN) {
				if (result.IsCommentSet(result)) {
					result.UnsetComment(result, iterator.pos.buffer_pos);
				} else {
					result.AddRow(result, iterator.pos.buffer_pos);
				}
				iterator.pos.buffer_pos++;
				lines_read++;
				return;
			}
			lines_read++;
			iterator.pos.buffer_pos++;
			break;
		case CSVState::CARRIAGE_RETURN:
			if (states.states[0] != CSVState::RECORD_SEPARATOR) {
				if (result.IsCommentSet(result)) {
					result.UnsetComment(result, iterator.pos.buffer_pos);
				} else {
					result.AddRow(result, iterator.pos.buffer_pos);
				}
				iterator.pos.buffer_pos++;
				lines_read++;
				return;
			} else {
				result.EmptyLine(result, iterator.pos.buffer_pos);
				iterator.pos.buffer_pos++;
				lines_read++;
				return;
			}
			break;
		case CSVState::DELIMITER:
			result.AddValue(result, iterator.pos.buffer_pos);
			iterator.pos.buffer_pos++;
			break;
		case CSVState::QUOTED:
			if (states.states[0] == CSVState::UNQUOTED) {
				result.SetEscaped(result);
			}
			result.SetQuoted(result, iterator.pos.buffer_pos);
			iterator.pos.buffer_pos++;
			while (state_machine->transition_array
			           .skip_quoted[static_cast<uint8_t>(buffer_handle_ptr[iterator.pos.buffer_pos])] &&
			       iterator.pos.buffer_pos < to_pos - 1) {
				iterator.pos.buffer_pos++;
			}
			break;
		case CSVState::ESCAPE:
		case CSVState::UNQUOTED_ESCAPE:
		case CSVState::ESCAPED_RETURN:
			result.SetEscaped(result);
			iterator.pos.buffer_pos++;
			break;
		case CSVState::STANDARD:
			iterator.pos.buffer_pos++;
			while (state_machine->transition_array
			           .skip_standard[static_cast<uint8_t>(buffer_handle_ptr[iterator.pos.buffer_pos])] &&
			       iterator.pos.buffer_pos < to_pos - 1) {
				iterator.pos.buffer_pos++;
			}
			break;
		case CSVState::UNQUOTED: {
			result.SetUnquoted(result);
			iterator.pos.buffer_pos++;
			break;
		}
		case CSVState::COMMENT:
			result.SetComment(result, iterator.pos.buffer_pos);
			iterator.pos.buffer_pos++;
			while (state_machine->transition_array
			           .skip_comment[static_cast<uint8_t>(buffer_handle_ptr[iterator.pos.buffer_pos])] &&
			       iterator.pos.buffer_pos < to_pos - 1) {
				iterator.pos.buffer_pos++;
			}
			break;
		case CSVState::QUOTED_NEW_LINE:
			result.quoted_new_line = true;
			result.NullPaddingQuotedNewlineCheck();
			iterator.pos.buffer_pos++;
			break;
		default:
			iterator.pos.buffer_pos++;
			break;
		}
	}
}